

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpplocate.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cpplocate::libExtensions_abi_cxx11_(void)

{
  uint in_ECX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  uint i;
  ulong uVar1;
  long lVar2;
  uint count;
  uint *lengths;
  char **extensions;
  uint local_54;
  uint *local_50;
  char **local_48;
  string local_40;
  
  local_48 = (char **)0x0;
  local_50 = (uint *)0x0;
  local_54 = 0;
  ::libExtensions(&local_48,&local_50,&local_54);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_RDI,(ulong)local_54,(allocator_type *)&local_40);
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < local_54; uVar1 = uVar1 + 1) {
    (anonymous_namespace)::obtainStringFromLibLocate_abi_cxx11_
              (&local_40,(_anonymous_namespace_ *)local_48[uVar1],(char *)(ulong)local_50[uVar1],
               in_ECX);
    std::__cxx11::string::operator=
              ((string *)
               ((long)&(((in_RDI->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar2),
               (string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    lVar2 = lVar2 + 0x20;
  }
  if (local_54 != 0) {
    free(local_48);
    free(local_50);
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> libExtensions()
{
    char ** extensions = nullptr;
    unsigned int * lengths = nullptr;
    unsigned int count = 0;

    ::libExtensions(&extensions, &lengths, &count);

    // Convert c-array of c-strings and handle memory ownership
    auto result = std::vector<std::string>(count);

    for (auto i = 0u; i < count; ++i)
    {
        // Convert to string and free memory from liblocate
        result[i] = obtainStringFromLibLocate(extensions[i], lengths[i]);
    }

    if (count > 0)
    {
        free(extensions);
        free(lengths);
    }

    return result;
}